

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::RegisterDnssecUsageByPrefix
          (DnsStats *this,BinHash<DnssecPrefixEntry> *dnssecTable,uint8_t *prefix,
          size_t prefix_length,bool is_dnssec)

{
  bool stored;
  DnssecPrefixEntry dpe;
  bool local_59;
  DnssecPrefixEntry local_58;
  
  DnssecPrefixEntry::DnssecPrefixEntry(&local_58);
  local_59 = false;
  local_58.prefix = prefix;
  local_58.prefix_len = prefix_length;
  local_58.is_dnssec = is_dnssec;
  BinHash<DnssecPrefixEntry>::InsertOrAdd(dnssecTable,&local_58,true,&local_59);
  DnssecPrefixEntry::~DnssecPrefixEntry(&local_58);
  return;
}

Assistant:

void DnsStats::RegisterDnssecUsageByPrefix(
    BinHash<DnssecPrefixEntry> * dnssecTable,
    uint8_t * prefix, size_t prefix_length, bool is_dnssec)
{
    DnssecPrefixEntry dpe;
    bool stored = false;

    dpe.prefix = prefix;
    dpe.prefix_len = prefix_length;
    dpe.is_dnssec = is_dnssec;

    dnssecTable->InsertOrAdd(&dpe, true, &stored);
}